

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDecompress.c
# Opt level: O2

UINT64 GetDecodedSizeOfBuf(UINT8 *EncodedData)

{
  UINT64 UVar1;
  INT32 Index;
  ulong uVar2;
  
  UVar1 = 0;
  for (uVar2 = 0xc; 4 < uVar2; uVar2 = uVar2 - 1) {
    UVar1 = UVar1 << 8 | (ulong)EncodedData[uVar2];
  }
  return UVar1;
}

Assistant:

UINT64
GetDecodedSizeOfBuf (
    UINT8 *EncodedData
    )
{
    UINT64 DecodedSize;
    INT32  Index;

    // Parse header
    DecodedSize = 0;
    for (Index = LZMA_PROPS_SIZE + 7; Index >= LZMA_PROPS_SIZE; Index--)
        DecodedSize = LShiftU64(DecodedSize, 8) + EncodedData[Index];

    return DecodedSize;
}